

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocmat.h
# Opt level: O2

void __thiscall TPZPostProcVar::~TPZPostProcVar(TPZPostProcVar *this,void **vtt)

{
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  std::__cxx11::string::~string((string *)&this->fName);
  return;
}

Assistant:

~TPZPostProcVar(){}